

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O3

ptr<resp_msg> __thiscall cornerstone::raft_server::handle_vote_req(raft_server *this,req_msg *req)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  element_type *peVar4;
  ulong uVar5;
  long lVar6;
  pointer psVar7;
  bool bVar8;
  undefined8 *puVar9;
  undefined8 uVar10;
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  undefined1 auVar12 [16];
  ptr<resp_msg> pVar13;
  long *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  ulong *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  peVar4 = ((req[3].log_entries_.
             super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
           super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar1 = *(undefined4 *)(in_RDX + 0x14);
  puVar9 = (undefined8 *)operator_new(0x40);
  puVar9[1] = 0x100000001;
  *puVar9 = &PTR___Sp_counted_ptr_inplace_00178730;
  uVar2 = *(undefined4 *)((long)&(req->super_msg_base).term_ + 4);
  puVar9[3] = peVar4;
  *(undefined4 *)(puVar9 + 4) = 2;
  *(undefined4 *)((long)puVar9 + 0x24) = uVar2;
  *(undefined4 *)(puVar9 + 5) = uVar1;
  puVar9[2] = &PTR__msg_base_00178780;
  puVar9[6] = 0;
  *(undefined1 *)(puVar9 + 7) = 0;
  *(undefined8 **)&this->leader_ = puVar9;
  this->_vptr_raft_server = (_func_int **)(puVar9 + 2);
  uVar5 = *(ulong *)(in_RDX + 0x20);
  (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x20))(&local_40);
  if (*local_40 < uVar5) {
    bVar8 = false;
    _Var11._M_pi = extraout_RDX;
  }
  else {
    lVar6 = *(long *)(in_RDX + 0x20);
    (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x20))(&local_50);
    bVar8 = true;
    _Var11._M_pi = extraout_RDX_00;
    if (lVar6 == *local_50) {
      auVar12 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
      _Var11._M_pi = auVar12._8_8_;
      bVar8 = *(ulong *)(in_RDX + 0x28) < auVar12._0_8_ - 1U;
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      _Var11._M_pi = extraout_RDX_01;
    }
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    _Var11._M_pi = extraout_RDX_02;
  }
  psVar7 = req[3].log_entries_.
           super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((!bVar8 && *(element_type **)(in_RDX + 8) ==
                 (psVar7->super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr) &&
     ((iVar3 = *(int *)&(psVar7->
                        super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_refcount._M_pi, iVar3 == -1 || (iVar3 == *(int *)(in_RDX + 0x14))))) {
    uVar10 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
    puVar9[6] = uVar10;
    *(undefined1 *)(puVar9 + 7) = 1;
    *(undefined4 *)
     &((req[3].log_entries_.
        super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         *(undefined4 *)(in_RDX + 0x14);
    (**(code **)(((((req->log_entries_).
                    super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 term_ + 0x20))();
    _Var11._M_pi = extraout_RDX_03;
  }
  pVar13.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var11._M_pi;
  pVar13.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar13.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<resp_msg> raft_server::handle_vote_req(req_msg& req)
{
    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::vote_response, id_, req.get_src()));
    bool log_okay = req.get_last_log_term() > log_store_->last_entry()->get_term() ||
                    (req.get_last_log_term() == log_store_->last_entry()->get_term() &&
                     log_store_->next_slot() - 1 <= req.get_last_log_idx());
    bool grant = req.get_term() == state_->get_term() && log_okay &&
                 (state_->get_voted_for() == req.get_src() || state_->get_voted_for() == -1);
    if (grant)
    {
        resp->accept(log_store_->next_slot());
        state_->set_voted_for(req.get_src());
        ctx_->state_mgr_->save_state(*state_);
    }

    return resp;
}